

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurCharReader::parse(OurCharReader *this,char *beginDoc,char *endDoc,Value *root,string *errs)

{
  string local_58;
  byte local_31;
  string *psStack_30;
  bool ok;
  string *errs_local;
  Value *root_local;
  char *endDoc_local;
  char *beginDoc_local;
  OurCharReader *this_local;
  
  psStack_30 = errs;
  errs_local = (string *)root;
  root_local = (Value *)endDoc;
  endDoc_local = beginDoc;
  beginDoc_local = (char *)this;
  local_31 = OurReader::parse(&this->reader_,beginDoc,endDoc,root,(bool)(this->collectComments_ & 1)
                             );
  if (psStack_30 != (string *)0x0) {
    OurReader::getFormattedErrorMessages_abi_cxx11_(&local_58,&this->reader_);
    std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool parse(
      char const* beginDoc, char const* endDoc,
      Value* root, JSONCPP_STRING* errs) JSONCPP_OVERRIDE {
    bool ok = reader_.parse(beginDoc, endDoc, *root, collectComments_);
    if (errs) {
      *errs = reader_.getFormattedErrorMessages();
    }
    return ok;
  }